

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vk_mem_alloc.h
# Opt level: O2

void __thiscall
VmaPoolAllocator<VmaAllocation_T>::Free
          (VmaPoolAllocator<VmaAllocation_T> *this,VmaAllocation_T *ptr)

{
  Item *pIVar1;
  size_t sVar2;
  uint32_t *puVar3;
  bool bVar4;
  
  sVar2 = (this->m_ItemBlocks).m_Count;
  puVar3 = &(this->m_ItemBlocks).m_pArray[sVar2 - 1].FirstFreeIndex;
  while( true ) {
    bVar4 = sVar2 == 0;
    sVar2 = sVar2 - 1;
    if (bVar4) {
      return;
    }
    pIVar1 = ((ItemBlock *)(puVar3 + -3))->pItems;
    if ((pIVar1 <= ptr) && (ptr < pIVar1 + puVar3[-1])) break;
    puVar3 = puVar3 + -4;
  }
  *(uint32_t *)&ptr->field_0 = *puVar3;
  *puVar3 = (uint32_t)(((long)ptr - (long)pIVar1) / 0x58);
  return;
}

Assistant:

void VmaPoolAllocator<T>::Free(T* ptr)
{
    // Search all memory blocks to find ptr.
    for (size_t i = m_ItemBlocks.size(); i--; )
    {
        ItemBlock& block = m_ItemBlocks[i];

        // Casting to union.
        Item* pItemPtr;
        memcpy(&pItemPtr, &ptr, sizeof(pItemPtr));

        // Check if pItemPtr is in address range of this block.
        if ((pItemPtr >= block.pItems) && (pItemPtr < block.pItems + block.Capacity))
        {
            ptr->~T(); // Explicit destructor call.
            const uint32_t index = static_cast<uint32_t>(pItemPtr - block.pItems);
            pItemPtr->NextFreeIndex = block.FirstFreeIndex;
            block.FirstFreeIndex = index;
            return;
        }
    }
    VMA_ASSERT(0 && "Pointer doesn't belong to this memory pool.");
}